

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aead128a_enc.c
# Opt level: O1

void test_aead128a_encryption(void)

{
  uint8_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  vecs_err_t vVar10;
  long lVar11;
  long lVar12;
  byte bVar13;
  undefined8 uVar14;
  uint64_t uVar15;
  long lVar16;
  ulong uVar17;
  uint64_t *puVar18;
  byte bVar19;
  bool bVar20;
  undefined1 auVar21 [32];
  undefined1 in_ZMM0 [64];
  uint8_t obtained_ciphertext [1];
  undefined1 auStack_1a7 [15];
  uint8_t obtained_tag [16];
  uint8_t obtained_tag_4 [16];
  ascon_aead_ctx_t ctx;
  undefined1 local_f0 [48];
  undefined1 local_c0 [20];
  undefined1 local_ac [16];
  vecs_ctx_t local_9c;
  ascon_aead_ctx_t aead_ctx;
  
  auVar21 = in_ZMM0._0_32_;
  puts("Testing Ascon-128a encryption...");
  ctx.bufstate.sponge._0_32_ = vpcmpeqd_avx2(auVar21,auVar21);
  ctx._64_24_ = ctx.bufstate.sponge._8_24_;
  ctx.bufstate._32_24_ = ctx.bufstate.sponge._0_24_;
  ctx.bufstate._56_8_ = ctx.bufstate.sponge.x3;
  ascon_aead_cleanup();
  lVar11 = 0;
  do {
    if (ctx.bufstate.buffer[lVar11 + -0x28] != '\0') {
      printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
             ,0x16,"test_aead_cleanup",atto_counter);
      atto_at_least_one_fail = '\x01';
      break;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x58);
  memcpy(&ctx,&DAT_00121320,0xd0);
  if (ctx.bufstate.sponge.x0 == ctx.bufstate.sponge.x2) {
    obtained_tag[0] = '\0';
    obtained_tag[1] = '\0';
    obtained_tag[2] = '\0';
    obtained_tag[3] = '\0';
    obtained_tag[4] = '\0';
    obtained_tag[5] = '\0';
    obtained_tag[6] = '\0';
    obtained_tag[7] = '\0';
    obtained_tag[8] = '\0';
    obtained_tag[9] = '\0';
    obtained_tag[10] = '\0';
    obtained_tag[0xb] = '\0';
    obtained_tag[0xc] = '\0';
    obtained_tag[0xd] = '\0';
    obtained_tag[0xe] = '\0';
    obtained_tag[0xf] = '\0';
    auVar2[0xf] = 0;
    auVar2._0_15_ = auStack_1a7;
    _obtained_ciphertext = (vecs_ctx_t)(auVar2 << 8);
    ascon_aead128a_encrypt
              (obtained_ciphertext,obtained_tag,local_c0,local_ac,&ctx.k1,ctx.bufstate.buffer,
               ctx.bufstate.sponge.x1,ctx.bufstate.sponge.x0,0x10);
    vecs_aead_enc_log((vecs_aead_t *)&ctx,obtained_ciphertext,obtained_tag,ctx.bufstate.sponge.x2);
    iVar9 = bcmp(obtained_ciphertext,local_f0,ctx.bufstate.sponge.x2);
    uVar14 = 0x43;
    if ((iVar9 != 0) || (uVar14 = 0x44, (vecs_ctx_t)obtained_tag != local_9c)) goto LAB_001117ec;
    auVar3[0xf] = 0;
    auVar3._0_15_ = auStack_1a7;
    _obtained_ciphertext = (vecs_ctx_t)(auVar3 << 8);
    obtained_tag[0] = '\0';
    obtained_tag[1] = '\0';
    obtained_tag[2] = '\0';
    obtained_tag[3] = '\0';
    obtained_tag[4] = '\0';
    obtained_tag[5] = '\0';
    obtained_tag[6] = '\0';
    obtained_tag[7] = '\0';
    obtained_tag[8] = '\0';
    obtained_tag[9] = '\0';
    obtained_tag[10] = '\0';
    obtained_tag[0xb] = '\0';
    obtained_tag[0xc] = '\0';
    obtained_tag[0xd] = '\0';
    obtained_tag[0xe] = '\0';
    obtained_tag[0xf] = '\0';
    ascon_aead128a_init(&aead_ctx,local_c0,local_ac);
    uVar14 = 0x4a;
    if (aead_ctx.bufstate.buffer_len != '\0') goto LAB_001117ec;
    lVar11 = ascon_aead128a_encrypt_final(&aead_ctx,obtained_ciphertext,obtained_tag,0x10);
    vecs_aead_enc_log((vecs_aead_t *)&ctx,obtained_ciphertext,obtained_tag,ctx.bufstate.sponge.x2);
    uVar14 = 0x51;
    if (lVar11 != 0) goto LAB_001117ec;
    iVar9 = bcmp(obtained_ciphertext,local_f0,ctx.bufstate.sponge.x2);
    uVar14 = 0x54;
    if ((iVar9 != 0) || (uVar14 = 0x55, (vecs_ctx_t)obtained_tag != local_9c)) goto LAB_001117ec;
    lVar11 = 0;
    do {
      if (aead_ctx.bufstate.buffer[lVar11 + -0x28] != '\0') {
        uVar14 = 0x56;
        goto LAB_001117ec;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x58);
    auVar4[0xf] = 0;
    auVar4._0_15_ = auStack_1a7;
    _obtained_ciphertext = (vecs_ctx_t)(auVar4 << 8);
    obtained_tag[0] = '\0';
    obtained_tag[1] = '\0';
    obtained_tag[2] = '\0';
    obtained_tag[3] = '\0';
    obtained_tag[4] = '\0';
    obtained_tag[5] = '\0';
    obtained_tag[6] = '\0';
    obtained_tag[7] = '\0';
    obtained_tag[8] = '\0';
    obtained_tag[9] = '\0';
    obtained_tag[10] = '\0';
    obtained_tag[0xb] = '\0';
    obtained_tag[0xc] = '\0';
    obtained_tag[0xd] = '\0';
    obtained_tag[0xe] = '\0';
    obtained_tag[0xf] = '\0';
    ascon_aead128a_init(&aead_ctx,local_c0,local_ac);
    ascon_aead128a_assoc_data_update(&aead_ctx,0,0);
    ascon_aead128a_assoc_data_update(&aead_ctx,obtained_ciphertext,0);
    ascon_aead128a_assoc_data_update(&aead_ctx,0,0);
    lVar11 = ascon_aead128a_encrypt_final(&aead_ctx,obtained_ciphertext,obtained_tag,0x10);
    vecs_aead_enc_log((vecs_aead_t *)&ctx,obtained_ciphertext,obtained_tag,ctx.bufstate.sponge.x2);
    uVar14 = 100;
    if (lVar11 != 0) goto LAB_001117ec;
    iVar9 = bcmp(obtained_ciphertext,local_f0,ctx.bufstate.sponge.x2);
    uVar14 = 0x67;
    if ((iVar9 != 0) || (uVar14 = 0x68, (vecs_ctx_t)obtained_tag != local_9c)) goto LAB_001117ec;
    lVar11 = 0;
    do {
      if (aead_ctx.bufstate.buffer[lVar11 + -0x28] != '\0') {
        uVar14 = 0x69;
        goto LAB_001117ec;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x58);
    auVar5[0xf] = 0;
    auVar5._0_15_ = auStack_1a7;
    _obtained_ciphertext = (vecs_ctx_t)(auVar5 << 8);
    obtained_tag[0] = '\0';
    obtained_tag[1] = '\0';
    obtained_tag[2] = '\0';
    obtained_tag[3] = '\0';
    obtained_tag[4] = '\0';
    obtained_tag[5] = '\0';
    obtained_tag[6] = '\0';
    obtained_tag[7] = '\0';
    obtained_tag[8] = '\0';
    obtained_tag[9] = '\0';
    obtained_tag[10] = '\0';
    obtained_tag[0xb] = '\0';
    obtained_tag[0xc] = '\0';
    obtained_tag[0xd] = '\0';
    obtained_tag[0xe] = '\0';
    obtained_tag[0xf] = '\0';
    ascon_aead128a_init(&aead_ctx,local_c0,local_ac);
    lVar11 = ascon_aead128a_encrypt_update(&aead_ctx,0,0,0);
    uVar14 = 0x70;
    if (lVar11 != 0) goto LAB_001117ec;
    lVar11 = ascon_aead128a_encrypt_update(&aead_ctx,0,obtained_ciphertext,0);
    uVar14 = 0x73;
    if (lVar11 != 0) goto LAB_001117ec;
    lVar11 = ascon_aead128a_encrypt_update(&aead_ctx,0,obtained_ciphertext,0);
    uVar14 = 0x76;
    if (lVar11 != 0) goto LAB_001117ec;
    lVar11 = ascon_aead128a_encrypt_update(&aead_ctx,obtained_ciphertext,obtained_ciphertext,0);
    uVar14 = 0x79;
    if (lVar11 != 0) goto LAB_001117ec;
    lVar11 = ascon_aead128a_encrypt_final(&aead_ctx,obtained_ciphertext,obtained_tag,0x10);
    vecs_aead_enc_log((vecs_aead_t *)&ctx,obtained_ciphertext,obtained_tag,ctx.bufstate.sponge.x2);
    uVar14 = 0x7f;
    if (lVar11 != 0) goto LAB_001117ec;
    iVar9 = bcmp(obtained_ciphertext,local_f0,ctx.bufstate.sponge.x2);
    uVar14 = 0x81;
    if ((iVar9 != 0) || (uVar14 = 0x82, (vecs_ctx_t)obtained_tag != local_9c)) goto LAB_001117ec;
    lVar11 = 0;
    do {
      if (aead_ctx.bufstate.buffer[lVar11 + -0x28] != '\0') {
        uVar14 = 0x83;
        goto LAB_001117ec;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x58);
    auVar6[0xf] = 0;
    auVar6._0_15_ = auStack_1a7;
    _obtained_ciphertext = (vecs_ctx_t)(auVar6 << 8);
    obtained_tag[0] = '\0';
    obtained_tag[1] = '\0';
    obtained_tag[2] = '\0';
    obtained_tag[3] = '\0';
    obtained_tag[4] = '\0';
    obtained_tag[5] = '\0';
    obtained_tag[6] = '\0';
    obtained_tag[7] = '\0';
    obtained_tag[8] = '\0';
    obtained_tag[9] = '\0';
    obtained_tag[10] = '\0';
    obtained_tag[0xb] = '\0';
    obtained_tag[0xc] = '\0';
    obtained_tag[0xd] = '\0';
    obtained_tag[0xe] = '\0';
    obtained_tag[0xf] = '\0';
    ascon_aead128a_init(&aead_ctx,local_c0,local_ac);
    ascon_aead128a_assoc_data_update(&aead_ctx,0,0);
    ascon_aead128a_assoc_data_update(&aead_ctx,obtained_ciphertext,0);
    ascon_aead128a_assoc_data_update(&aead_ctx,0,0);
    lVar11 = ascon_aead128a_encrypt_update(&aead_ctx,0,0,0);
    uVar14 = 0x8d;
    if (lVar11 != 0) goto LAB_001117ec;
    lVar11 = ascon_aead128a_encrypt_update(&aead_ctx,0,obtained_ciphertext,0);
    uVar14 = 0x90;
    if (lVar11 != 0) goto LAB_001117ec;
    lVar11 = ascon_aead128a_encrypt_update(&aead_ctx,0,obtained_ciphertext,0);
    uVar14 = 0x93;
    if (lVar11 != 0) goto LAB_001117ec;
    lVar11 = ascon_aead128a_encrypt_update(&aead_ctx,obtained_ciphertext,obtained_ciphertext,0);
    uVar14 = 0x96;
    if (lVar11 != 0) goto LAB_001117ec;
    lVar11 = ascon_aead128a_encrypt_final(&aead_ctx,obtained_ciphertext,obtained_tag,0x10);
    vecs_aead_enc_log((vecs_aead_t *)&ctx,obtained_ciphertext,obtained_tag,ctx.bufstate.sponge.x2);
    uVar14 = 0x9c;
    if (lVar11 != 0) goto LAB_001117ec;
    iVar9 = bcmp(obtained_ciphertext,local_f0,ctx.bufstate.sponge.x2);
    uVar14 = 0x9e;
    if ((iVar9 != 0) || (uVar14 = 0x9f, (vecs_ctx_t)obtained_tag != local_9c)) goto LAB_001117ec;
    lVar11 = 0;
    do {
      if (aead_ctx.bufstate.buffer[lVar11 + -0x28] != '\0') {
        uVar14 = 0xa0;
        goto LAB_001117ec;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x58);
  }
  else {
    uVar14 = 0x2e;
LAB_001117ec:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,uVar14,"test_encrypt_empty",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  memcpy(&ctx,&DAT_001213f0,0xd0);
  if (ctx.bufstate.sponge.x0 == ctx.bufstate.sponge.x2) {
    auVar7[0xf] = 0;
    auVar7._0_15_ = auStack_1a7;
    _obtained_ciphertext = (vecs_ctx_t)(auVar7 << 8);
    obtained_tag[0] = '\0';
    obtained_tag[1] = '\0';
    obtained_tag[2] = '\0';
    obtained_tag[3] = '\0';
    obtained_tag[4] = '\0';
    obtained_tag[5] = '\0';
    obtained_tag[6] = '\0';
    obtained_tag[7] = '\0';
    obtained_tag[8] = '\0';
    obtained_tag[9] = '\0';
    obtained_tag[10] = '\0';
    obtained_tag[0xb] = '\0';
    obtained_tag[0xc] = '\0';
    obtained_tag[0xd] = '\0';
    obtained_tag[0xe] = '\0';
    obtained_tag[0xf] = '\0';
    ascon_aead128a_init(&aead_ctx,local_c0,local_ac);
    ascon_aead128a_assoc_data_update(&aead_ctx,&ctx.k1,ctx.bufstate.sponge.x1);
    lVar11 = ascon_aead128a_encrypt_final(&aead_ctx,obtained_ciphertext,obtained_tag,0x10);
    vecs_aead_enc_log((vecs_aead_t *)&ctx,obtained_ciphertext,obtained_tag,ctx.bufstate.sponge.x2);
    uVar14 = 0xcc;
    if (lVar11 != 0) goto LAB_00111a41;
    iVar9 = bcmp(obtained_ciphertext,local_f0,ctx.bufstate.sponge.x2);
    uVar14 = 0xce;
    if ((iVar9 != 0) || (uVar14 = 0xcf, (vecs_ctx_t)obtained_tag != local_9c)) goto LAB_00111a41;
    lVar11 = 0;
    do {
      if (aead_ctx.bufstate.buffer[lVar11 + -0x28] != '\0') {
        uVar14 = 0xd0;
        goto LAB_00111a41;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x58);
    auVar8[0xf] = 0;
    auVar8._0_15_ = auStack_1a7;
    _obtained_ciphertext = (vecs_ctx_t)(auVar8 << 8);
    obtained_tag[0] = '\0';
    obtained_tag[1] = '\0';
    obtained_tag[2] = '\0';
    obtained_tag[3] = '\0';
    obtained_tag[4] = '\0';
    obtained_tag[5] = '\0';
    obtained_tag[6] = '\0';
    obtained_tag[7] = '\0';
    obtained_tag[8] = '\0';
    obtained_tag[9] = '\0';
    obtained_tag[10] = '\0';
    obtained_tag[0xb] = '\0';
    obtained_tag[0xc] = '\0';
    obtained_tag[0xd] = '\0';
    obtained_tag[0xe] = '\0';
    obtained_tag[0xf] = '\0';
    ascon_aead128a_init(&aead_ctx,local_c0,local_ac);
    ascon_aead128a_assoc_data_update(&aead_ctx,&ctx.k1,ctx.bufstate.sponge.x1);
    lVar11 = ascon_aead128a_encrypt_update
                       (&aead_ctx,obtained_ciphertext,ctx.bufstate.buffer,ctx.bufstate.sponge.x0);
    uVar14 = 0xdb;
    if (lVar11 != 0) goto LAB_00111a41;
    lVar11 = ascon_aead128a_encrypt_final(&aead_ctx,obtained_ciphertext,obtained_tag,0x10);
    vecs_aead_enc_log((vecs_aead_t *)&ctx,obtained_ciphertext,obtained_tag,ctx.bufstate.sponge.x2);
    uVar14 = 0xe1;
    if (lVar11 != 0) goto LAB_00111a41;
    iVar9 = bcmp(obtained_ciphertext,local_f0,ctx.bufstate.sponge.x2);
    uVar14 = 0xe4;
    if ((iVar9 != 0) || (uVar14 = 0xe5, (vecs_ctx_t)obtained_tag != local_9c)) goto LAB_00111a41;
    lVar11 = 0;
    do {
      if (aead_ctx.bufstate.buffer[lVar11 + -0x28] != '\0') {
        uVar14 = 0xe6;
        goto LAB_00111a41;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x58);
  }
  else {
    uVar14 = 0xba;
LAB_00111a41:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,uVar14,"test_encrypt_1_byte_ad_empty_pt",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  memcpy(&ctx,&DAT_001214c0,0xd0);
  if (ctx.bufstate.sponge.x0 == ctx.bufstate.sponge.x2) {
    obtained_tag = (uint8_t  [16])ZEXT816(0);
    _obtained_ciphertext = (FILE *)0x0;
    auStack_1a7._7_8_ = 0;
    ascon_aead128a_init(&aead_ctx,local_c0,local_ac);
    puVar1 = ctx.bufstate.buffer;
    lVar11 = ascon_aead128a_encrypt_update(&aead_ctx,obtained_tag,puVar1,ctx.bufstate.sponge.x0);
    uVar14 = 0x10e;
    if (lVar11 != 0) goto LAB_00111cd0;
    lVar11 = ascon_aead128a_encrypt_final(&aead_ctx,obtained_tag,obtained_ciphertext,0x10);
    vecs_aead_enc_log((vecs_aead_t *)&ctx,obtained_tag,obtained_ciphertext,ctx.bufstate.sponge.x2);
    uVar14 = 0x114;
    if (lVar11 != 1) goto LAB_00111cd0;
    iVar9 = bcmp(obtained_tag,local_f0,ctx.bufstate.sponge.x2);
    uVar14 = 0x116;
    if ((iVar9 != 0) || (uVar14 = 0x117, _obtained_ciphertext != local_9c)) goto LAB_00111cd0;
    lVar11 = 0;
    do {
      if (aead_ctx.bufstate.buffer[lVar11 + -0x28] != '\0') {
        uVar14 = 0x118;
        goto LAB_00111cd0;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x58);
    obtained_tag = (uint8_t  [16])ZEXT816(0);
    _obtained_ciphertext = (FILE *)0x0;
    auStack_1a7._7_8_ = 0;
    ascon_aead128a_init(&aead_ctx,local_c0,local_ac);
    ascon_aead128a_assoc_data_update(&aead_ctx,&ctx.k1,ctx.bufstate.sponge.x1);
    lVar11 = ascon_aead128a_encrypt_update(&aead_ctx,obtained_tag,puVar1,ctx.bufstate.sponge.x0);
    uVar14 = 0x123;
    if (lVar11 != 0) goto LAB_00111cd0;
    lVar11 = ascon_aead128a_encrypt_final(&aead_ctx,obtained_tag,obtained_ciphertext,0x10);
    vecs_aead_enc_log((vecs_aead_t *)&ctx,obtained_tag,obtained_ciphertext,ctx.bufstate.sponge.x2);
    uVar14 = 0x129;
    if (lVar11 != 1) goto LAB_00111cd0;
    iVar9 = bcmp(obtained_tag,local_f0,ctx.bufstate.sponge.x2);
    uVar14 = 300;
    if ((iVar9 != 0) || (uVar14 = 0x12d, _obtained_ciphertext != local_9c)) goto LAB_00111cd0;
    lVar11 = 0;
    do {
      if (aead_ctx.bufstate.buffer[lVar11 + -0x28] != '\0') {
        uVar14 = 0x12e;
        goto LAB_00111cd0;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x58);
  }
  else {
    uVar14 = 0x100;
LAB_00111cd0:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,uVar14,"test_encrypt_1_byte_pt_empty_ad",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  memcpy(&ctx,&DAT_00121590,0xd0);
  if (ctx.bufstate.sponge.x0 == ctx.bufstate.sponge.x2) {
    obtained_tag = (uint8_t  [16])ZEXT816(0);
    _obtained_ciphertext = (FILE *)0x0;
    auStack_1a7._7_8_ = 0;
    ascon_aead128a_init(&aead_ctx,local_c0,local_ac);
    ascon_aead128a_assoc_data_update(&aead_ctx,&ctx.k1,ctx.bufstate.sponge.x1);
    lVar11 = ascon_aead128a_encrypt_update
                       (&aead_ctx,obtained_tag,ctx.bufstate.buffer,ctx.bufstate.sponge.x0);
    uVar14 = 0x157;
    if (lVar11 == 0) {
      lVar11 = ascon_aead128a_encrypt_final(&aead_ctx,obtained_tag,obtained_ciphertext,0x10);
      vecs_aead_enc_log((vecs_aead_t *)&ctx,obtained_tag,obtained_ciphertext,ctx.bufstate.sponge.x2)
      ;
      uVar14 = 0x15d;
      if (lVar11 == 1) {
        iVar9 = bcmp(obtained_tag,local_f0,ctx.bufstate.sponge.x2);
        uVar14 = 0x160;
        if (iVar9 == 0) {
          lVar11 = 0;
          do {
            if (aead_ctx.bufstate.buffer[lVar11 + -0x28] != '\0') {
              uVar14 = 0x161;
              goto LAB_00111e3d;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x58);
          goto LAB_00111e4e;
        }
      }
    }
  }
  else {
    uVar14 = 0x148;
  }
LAB_00111e3d:
  printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
         "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
         ,uVar14,"test_encrypt_1_byte_pt_1_byte_ad",atto_counter);
  atto_at_least_one_fail = '\x01';
LAB_00111e4e:
  vVar10 = vecs_init((vecs_ctx_t *)obtained_tag,"vectors/aead128a.txt",0x10);
  if (vVar10 == VECS_OK) {
    do {
      vVar10 = vecs_aead_next((vecs_ctx_t *)obtained_tag,(vecs_aead_t *)&ctx);
      if (vVar10 == VECS_EOF) goto LAB_00111ea1;
      atto_counter = ctx.bufstate.sponge.x3;
      if (vVar10 != VECS_OK) {
        uVar14 = 0x175;
        goto LAB_00111e90;
      }
      if (ctx.bufstate.sponge.x0 != ctx.bufstate.sponge.x2) {
        uVar14 = 0x176;
        goto LAB_00111e90;
      }
      aead_ctx.bufstate.sponge.x4 = 0;
      aead_ctx.bufstate.buffer[0] = '\0';
      aead_ctx.bufstate.buffer[1] = '\0';
      aead_ctx.bufstate.buffer[2] = '\0';
      aead_ctx.bufstate.buffer[3] = '\0';
      aead_ctx.bufstate.buffer[4] = '\0';
      aead_ctx.bufstate.buffer[5] = '\0';
      aead_ctx.bufstate.buffer[6] = '\0';
      aead_ctx.bufstate.buffer[7] = '\0';
      aead_ctx.bufstate.sponge.x0 = 0;
      aead_ctx.bufstate.sponge.x1 = 0;
      aead_ctx.bufstate.sponge.x2 = 0;
      aead_ctx.bufstate.sponge.x3 = 0;
      _obtained_ciphertext = (FILE *)0x0;
      auStack_1a7._7_8_ = 0;
      ascon_aead128a_encrypt
                (&aead_ctx,obtained_ciphertext,local_c0,local_ac,&ctx.k1,ctx.bufstate.buffer,
                 ctx.bufstate.sponge.x1,ctx.bufstate.sponge.x0,0x10);
      vecs_aead_enc_log((vecs_aead_t *)&ctx,(uint8_t *)&aead_ctx,obtained_ciphertext,
                        ctx.bufstate.sponge.x2);
      iVar9 = bcmp(&aead_ctx,local_f0,ctx.bufstate.sponge.x2);
      if (iVar9 != 0) {
        uVar14 = 0x186;
        goto LAB_00111e90;
      }
    } while (_obtained_ciphertext == local_9c);
    uVar14 = 0x187;
  }
  else {
    uVar14 = 0x16b;
  }
LAB_00111e90:
  printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
         "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
         ,uVar14,"test_encrypt_offline",atto_counter);
  atto_at_least_one_fail = '\x01';
LAB_00111ea1:
  vVar10 = vecs_init((vecs_ctx_t *)obtained_ciphertext,"vectors/aead128a.txt",0x10);
  if (vVar10 == VECS_OK) {
    vVar10 = vecs_aead_next((vecs_ctx_t *)obtained_ciphertext,(vecs_aead_t *)&ctx);
    if (vVar10 != VECS_EOF) {
      do {
        atto_counter = ctx.bufstate.sponge.x3;
        if (vVar10 != VECS_OK) {
          uVar14 = 0x19f;
          goto LAB_00111ee1;
        }
        if (ctx.bufstate.sponge.x0 != ctx.bufstate.sponge.x2) {
          uVar14 = 0x1a0;
          goto LAB_00111ee1;
        }
        obtained_tag = (uint8_t  [16])ZEXT816(0);
        obtained_tag_4[0] = '\0';
        obtained_tag_4[1] = '\0';
        obtained_tag_4[2] = '\0';
        obtained_tag_4[3] = '\0';
        obtained_tag_4[4] = '\0';
        obtained_tag_4[5] = '\0';
        obtained_tag_4[6] = '\0';
        obtained_tag_4[7] = '\0';
        obtained_tag_4[8] = '\0';
        obtained_tag_4[9] = '\0';
        obtained_tag_4[10] = '\0';
        obtained_tag_4[0xb] = '\0';
        obtained_tag_4[0xc] = '\0';
        obtained_tag_4[0xd] = '\0';
        obtained_tag_4[0xe] = '\0';
        obtained_tag_4[0xf] = '\0';
        ascon_aead128a_init(&aead_ctx,local_c0,local_ac);
        bVar19 = 1;
        puVar18 = &ctx.k1;
        uVar17 = 0;
        while (uVar17 < ctx.bufstate.sponge.x1) {
          ascon_aead128a_assoc_data_update(&aead_ctx,puVar18,1);
          uVar17 = uVar17 + 1;
          bVar13 = bVar19 & 0xf;
          bVar19 = bVar19 + 1;
          puVar18 = (uint64_t *)((long)puVar18 + 1);
          if (bVar13 != aead_ctx.bufstate.buffer_len) {
            uVar14 = 0x1aa;
            goto LAB_00111ee1;
          }
        }
        bVar20 = ctx.bufstate.sponge.x0 != 0;
        if (ctx.bufstate.sponge.x0 == 0) {
          lVar11 = 0;
        }
        else {
          uVar17 = 0;
          lVar11 = 0;
          do {
            lVar16 = ascon_aead128a_encrypt_update
                               (&aead_ctx,obtained_tag + lVar11,ctx.bufstate.buffer + uVar17,1);
            lVar11 = lVar11 + lVar16;
            uVar17 = uVar17 + 1;
            if (((uint)uVar17 & 0xf) != (uint)aead_ctx.bufstate.buffer_len) {
              uVar14 = 0x1b5;
LAB_00112217:
              printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
                     ,uVar14,"test_encrypt_update_single_byte",atto_counter);
              atto_at_least_one_fail = '\x01';
              break;
            }
            if (aead_ctx.bufstate.buffer_len == '\0') {
              if (lVar16 != 0x10) {
                uVar14 = 0x1b8;
                goto LAB_00112217;
              }
            }
            else if (lVar16 != 0) {
              uVar14 = 0x1bc;
              goto LAB_00112217;
            }
            bVar20 = uVar17 < ctx.bufstate.sponge.x0;
          } while (bVar20);
        }
        if (bVar20) break;
        uVar17 = ascon_aead128a_encrypt_final(&aead_ctx,obtained_tag + lVar11,obtained_tag_4,0x10);
        if (0xf < uVar17) {
          uVar14 = 0x1c4;
          goto LAB_00111ee1;
        }
        if (uVar17 != ((uint)ctx.bufstate.sponge.x2 & 0xf)) {
          uVar14 = 0x1c5;
          goto LAB_00111ee1;
        }
        if (uVar17 + lVar11 != ctx.bufstate.sponge.x2) {
          uVar14 = 0x1c6;
          goto LAB_00111ee1;
        }
        vecs_aead_enc_log((vecs_aead_t *)&ctx,obtained_tag,obtained_tag_4,ctx.bufstate.sponge.x2);
        iVar9 = bcmp(obtained_tag,local_f0,ctx.bufstate.sponge.x2);
        if (iVar9 != 0) {
          uVar14 = 0x1cb;
          goto LAB_00111ee1;
        }
        if ((vecs_ctx_t)obtained_tag_4 != local_9c) {
          uVar14 = 0x1cc;
          goto LAB_00111ee1;
        }
        lVar11 = 0;
        do {
          if (aead_ctx.bufstate.buffer[lVar11 + -0x28] != '\0') {
            uVar14 = 0x1cd;
            goto LAB_00111ee1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x58);
        vVar10 = vecs_aead_next((vecs_ctx_t *)obtained_ciphertext,(vecs_aead_t *)&ctx);
      } while (vVar10 != VECS_EOF);
    }
  }
  else {
    uVar14 = 0x192;
LAB_00111ee1:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,uVar14,"test_encrypt_update_single_byte",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  vVar10 = vecs_init((vecs_ctx_t *)obtained_ciphertext,"vectors/aead128a.txt",0x10);
  if (vVar10 == VECS_OK) {
    vVar10 = vecs_aead_next((vecs_ctx_t *)obtained_ciphertext,(vecs_aead_t *)&ctx);
    if (vVar10 != VECS_EOF) {
      do {
        atto_counter = ctx.bufstate.sponge.x3;
        if (vVar10 != VECS_OK) {
          uVar14 = 0x1e6;
          goto LAB_00111f32;
        }
        if (ctx.bufstate.sponge.x0 != ctx.bufstate.sponge.x2) {
          uVar14 = 0x1e7;
          goto LAB_00111f32;
        }
        obtained_tag = (uint8_t  [16])ZEXT816(0);
        obtained_tag_4 = (uint8_t  [16])ZEXT816(0);
        ascon_aead128a_init(&aead_ctx,local_c0,local_ac);
        if (ctx.bufstate.sponge.x1 != 0) {
          lVar11 = 0;
          uVar15 = ctx.bufstate.sponge.x1;
          do {
            uVar17 = 3;
            if (uVar15 < 3) {
              uVar17 = uVar15;
            }
            ascon_aead128a_assoc_data_update
                      (&aead_ctx,(long)(&ctx.bufstate + 1) + lVar11 + 8,uVar17);
            lVar11 = lVar11 + uVar17;
            if (((uint)lVar11 & 0xf) != (uint)aead_ctx.bufstate.buffer_len) {
              uVar14 = 0x1f7;
              goto LAB_00111f32;
            }
            uVar15 = uVar15 - uVar17;
          } while (uVar15 != 0);
        }
        if (ctx.bufstate.sponge.x0 == 0) {
          lVar11 = 0;
        }
        else {
          lVar16 = 0;
          lVar11 = 0;
          uVar15 = ctx.bufstate.sponge.x0;
          bVar19 = 0;
          do {
            uVar17 = 3;
            if (uVar15 < 3) {
              uVar17 = uVar15;
            }
            lVar12 = ascon_aead128a_encrypt_update
                               (&aead_ctx,obtained_tag + lVar11,ctx.bufstate.buffer + lVar16,uVar17)
            ;
            lVar16 = lVar16 + uVar17;
            if (((uint)lVar16 & 0xf) != (uint)aead_ctx.bufstate.buffer_len) {
              uVar14 = 0x208;
              goto LAB_00111f32;
            }
            if (aead_ctx.bufstate.buffer_len < bVar19) {
              if (lVar12 != 0x10) {
                uVar14 = 0x20b;
                goto LAB_00111f32;
              }
            }
            else if (lVar12 != 0) {
              uVar14 = 0x20f;
              goto LAB_00111f32;
            }
            lVar11 = lVar11 + lVar12;
            uVar15 = uVar15 - uVar17;
            bVar19 = aead_ctx.bufstate.buffer_len;
          } while (uVar15 != 0);
        }
        uVar17 = ascon_aead128a_encrypt_final(&aead_ctx,obtained_tag + lVar11,obtained_tag_4,0x10);
        if (0xf < uVar17) {
          uVar14 = 0x21a;
          goto LAB_00111f32;
        }
        if (uVar17 != ((uint)ctx.bufstate.sponge.x2 & 0xf)) {
          uVar14 = 0x21b;
          goto LAB_00111f32;
        }
        if (uVar17 + lVar11 != ctx.bufstate.sponge.x2) {
          uVar14 = 0x21c;
          goto LAB_00111f32;
        }
        vecs_aead_enc_log((vecs_aead_t *)&ctx,obtained_tag,obtained_tag_4,ctx.bufstate.sponge.x2);
        iVar9 = bcmp(obtained_tag,local_f0,ctx.bufstate.sponge.x2);
        if (iVar9 != 0) {
          uVar14 = 0x221;
          goto LAB_00111f32;
        }
        if ((vecs_ctx_t)obtained_tag_4 != local_9c) {
          uVar14 = 0x222;
          goto LAB_00111f32;
        }
        lVar11 = 0;
        do {
          if (aead_ctx.bufstate.buffer[lVar11 + -0x28] != '\0') {
            uVar14 = 0x223;
            goto LAB_00111f32;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x58);
        vVar10 = vecs_aead_next((vecs_ctx_t *)obtained_ciphertext,(vecs_aead_t *)&ctx);
      } while (vVar10 != VECS_EOF);
    }
  }
  else {
    uVar14 = 0x1d9;
LAB_00111f32:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,uVar14,"test_encrypt_update_three_bytes",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  vVar10 = vecs_init((vecs_ctx_t *)obtained_ciphertext,"vectors/aead128a.txt",0x10);
  if (vVar10 == VECS_OK) {
    vVar10 = vecs_aead_next((vecs_ctx_t *)obtained_ciphertext,(vecs_aead_t *)&ctx);
    if (vVar10 != VECS_EOF) {
      do {
        atto_counter = ctx.bufstate.sponge.x3;
        if (vVar10 != VECS_OK) {
          uVar14 = 0x23c;
          goto LAB_00111f89;
        }
        if (ctx.bufstate.sponge.x0 != ctx.bufstate.sponge.x2) {
          uVar14 = 0x23d;
          goto LAB_00111f89;
        }
        obtained_tag = (uint8_t  [16])ZEXT816(0);
        obtained_tag_4 = (uint8_t  [16])ZEXT816(0);
        ascon_aead128a_init(&aead_ctx,local_c0,local_ac);
        if (ctx.bufstate.sponge.x1 != 0) {
          lVar11 = 0;
          uVar17 = 0;
          uVar15 = ctx.bufstate.sponge.x1;
          do {
            uVar17 = uVar17 + 1;
            if (uVar15 < uVar17) {
              uVar17 = uVar15;
            }
            ascon_aead128a_assoc_data_update
                      (&aead_ctx,(long)(&ctx.bufstate + 1) + lVar11 + 8,uVar17);
            lVar11 = lVar11 + uVar17;
            if (((uint)lVar11 & 0xf) != (uint)aead_ctx.bufstate.buffer_len) {
              uVar14 = 0x24c;
              goto LAB_00111f89;
            }
            uVar15 = uVar15 - uVar17;
          } while (uVar15 != 0);
        }
        if (ctx.bufstate.sponge.x0 == 0) {
          lVar11 = 0;
        }
        else {
          lVar16 = 0;
          uVar17 = 0;
          lVar11 = 0;
          uVar15 = ctx.bufstate.sponge.x0;
          do {
            uVar17 = uVar17 + 1;
            if (uVar15 < uVar17) {
              uVar17 = uVar15;
            }
            lVar12 = ascon_aead128a_encrypt_update
                               (&aead_ctx,obtained_tag + lVar11,ctx.bufstate.buffer + lVar16,uVar17)
            ;
            lVar16 = lVar16 + uVar17;
            if (((uint)lVar16 & 0xf) != (uint)aead_ctx.bufstate.buffer_len) {
              uVar14 = 0x25e;
              goto LAB_00111f89;
            }
            lVar11 = lVar11 + lVar12;
            uVar15 = uVar15 - uVar17;
          } while (uVar15 != 0);
        }
        uVar17 = ascon_aead128a_encrypt_final(&aead_ctx,obtained_tag + lVar11,obtained_tag_4,0x10);
        if (0xf < uVar17) {
          uVar14 = 0x267;
          goto LAB_00111f89;
        }
        if (uVar17 != ((uint)ctx.bufstate.sponge.x2 & 0xf)) {
          uVar14 = 0x268;
          goto LAB_00111f89;
        }
        if (uVar17 + lVar11 != ctx.bufstate.sponge.x2) {
          uVar14 = 0x269;
          goto LAB_00111f89;
        }
        vecs_aead_enc_log((vecs_aead_t *)&ctx,obtained_tag,obtained_tag_4,ctx.bufstate.sponge.x2);
        iVar9 = bcmp(obtained_tag,local_f0,ctx.bufstate.sponge.x2);
        if (iVar9 != 0) {
          uVar14 = 0x26e;
          goto LAB_00111f89;
        }
        if ((vecs_ctx_t)obtained_tag_4 != local_9c) {
          uVar14 = 0x26f;
          goto LAB_00111f89;
        }
        lVar11 = 0;
        do {
          if (aead_ctx.bufstate.buffer[lVar11 + -0x28] != '\0') {
            uVar14 = 0x270;
            goto LAB_00111f89;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x58);
        vVar10 = vecs_aead_next((vecs_ctx_t *)obtained_ciphertext,(vecs_aead_t *)&ctx);
      } while (vVar10 != VECS_EOF);
    }
  }
  else {
    uVar14 = 0x22f;
LAB_00111f89:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,uVar14,"test_encrypt_update_var_bytes",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  return;
}

Assistant:

void test_aead128a_encryption(void)
{
    puts("Testing Ascon-128a encryption...");
    test_aead_cleanup();
    test_encrypt_empty();
    test_encrypt_1_byte_ad_empty_pt();
    test_encrypt_1_byte_pt_empty_ad();
    test_encrypt_1_byte_pt_1_byte_ad();
    test_encrypt_offline();
    test_encrypt_update_single_byte();
    test_encrypt_update_three_bytes();
    test_encrypt_update_var_bytes();
}